

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack_cursor_tests.cpp
# Opt level: O2

bool __thiscall
remove_mark_msgpack_filter::operator()
          (remove_mark_msgpack_filter *this,staj_event *event,ser_context *param_2)

{
  bool bVar1;
  bool bVar2;
  basic_string_view<char,_std::char_traits<char>_> __x;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  
  if (event->event_type_ == key) {
    __x = jsoncons::basic_staj_event<char>::get<std::basic_string_view<char,std::char_traits<char>>>
                    (event);
    __y._M_str = "mark";
    __y._M_len = 4;
    bVar1 = std::operator==(__x,__y);
    bVar2 = true;
    if (bVar1) goto LAB_004301b1;
  }
  if (this->reject_next_ != true) {
    return true;
  }
  bVar2 = false;
LAB_004301b1:
  this->reject_next_ = bVar2;
  return false;
}

Assistant:

bool operator()(const staj_event& event, const ser_context&) 
    {
        if (event.event_type()  == staj_event_type::key &&
            event.get<jsoncons::string_view>() == "mark")
        {
            reject_next_ = true;
            return false;
        }
        else if (reject_next_)
        {
            reject_next_ = false;
            return false;
        }
        else
        {
            return true;
        }
    }